

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict.cpp
# Opt level: O0

void __thiscall SAT::varBumpActivity(SAT *this,Lit p)

{
  double dVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  double *pdVar5;
  bool *pbVar6;
  ChannelInfo *pCVar7;
  IntVar **ppIVar8;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  size_t *extraout_RDX;
  size_t *extraout_RDX_00;
  size_t *extraout_RDX_01;
  size_t *siglen;
  Lit in_ESI;
  uchar *sig;
  Heap<SAT::VarOrderLt> *in_RDI;
  size_t in_R8;
  byte bVar9;
  int var_id;
  int v;
  undefined8 in_stack_ffffffffffffffb8;
  undefined6 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc6;
  undefined1 in_stack_ffffffffffffffc7;
  int *in_stack_ffffffffffffffc8;
  
  uVar3 = ::var(in_ESI);
  if ((so.vsids & 1U) != 0) {
    in_stack_ffffffffffffffc8 = *(int **)&in_RDI[10].heap;
    pdVar5 = vec<double>::operator[]((vec<double> *)&in_RDI[10].indices,uVar3);
    *pdVar5 = (double)in_stack_ffffffffffffffc8 + *pdVar5;
    sig = (uchar *)(ulong)uVar3;
    bVar2 = Heap<SAT::VarOrderLt>::inHeap(in_RDI,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
    siglen = extraout_RDX;
    if (bVar2) {
      sig = (uchar *)(ulong)uVar3;
      Heap<SAT::VarOrderLt>::decrease
                ((Heap<SAT::VarOrderLt> *)
                 CONCAT17(in_stack_ffffffffffffffc7,
                          CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0)),
                 (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
      siglen = extraout_RDX_00;
    }
    if (so.sat_polarity == 1) {
      iVar4 = sign((EVP_PKEY_CTX *)(ulong)(uint)in_ESI.x,sig,siglen,
                   (uchar *)CONCAT71(in_register_00000009,in_CL),in_R8);
      bVar9 = ((byte)iVar4 & 1) != 1;
      sig = (uchar *)(ulong)uVar3;
      pbVar6 = vec<bool>::operator[]((vec<bool> *)(in_RDI + 0xc),uVar3);
      in_CL = bVar9 & 1;
      *pbVar6 = (bool)in_CL;
      siglen = extraout_RDX_01;
    }
    if (so.sat_polarity == 2) {
      iVar4 = sign((EVP_PKEY_CTX *)(ulong)(uint)in_ESI.x,sig,siglen,
                   (uchar *)CONCAT71(in_register_00000009,in_CL),in_R8);
      bVar9 = (byte)iVar4;
      pbVar6 = vec<bool>::operator[]((vec<bool> *)(in_RDI + 0xc),uVar3);
      *pbVar6 = (bool)(bVar9 & 1);
    }
  }
  pCVar7 = vec<ChannelInfo>::operator[]((vec<ChannelInfo> *)&in_RDI[1].heap,uVar3);
  if ((*(uint *)pCVar7 >> 0x1d & 3) == 1) {
    pCVar7 = vec<ChannelInfo>::operator[]((vec<ChannelInfo> *)&in_RDI[1].heap,uVar3);
    uVar3 = *(uint *)pCVar7 & 0x1fffffff;
    pbVar6 = vec<bool>::operator[]((vec<bool> *)&in_RDI[7].indices,uVar3);
    if ((*pbVar6 & 1U) == 0) {
      dVar1 = *(double *)&in_RDI[10].heap;
      ppIVar8 = vec<IntVar_*>::operator[](&engine.vars,uVar3);
      (*ppIVar8)->activity = dVar1 + (*ppIVar8)->activity;
      pbVar6 = vec<bool>::operator[]((vec<bool> *)&in_RDI[7].indices,uVar3);
      *pbVar6 = true;
      vec<int>::push((vec<int> *)in_RDI,in_stack_ffffffffffffffc8);
    }
  }
  return;
}

Assistant:

inline void SAT::varBumpActivity(Lit p) {
	const int v = var(p);
	if (so.vsids) {
		activity[v] += var_inc;
		if (order_heap.inHeap(v)) {
			order_heap.decrease(v);
		}
		if (so.sat_polarity == 1) {
			polarity[v] = ((static_cast<int>(sign(p)) ^ 1) != 0);
		}
		if (so.sat_polarity == 2) {
			polarity[v] = sign(p);
		}
	}
	if (c_info[v].cons_type == 1) {
		const int var_id = c_info[v].cons_id;
		if (!ivseen[var_id]) {
			engine.vars[var_id]->activity += var_inc;
			ivseen[var_id] = true;
			ivseen_toclear.push(var_id);
		}
	}
}